

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string *this_00;
  VoidPtr local_58;
  Invoker<std::__cxx11::basic_string<char>_> local_50;
  string_view local_48;
  undefined1 local_38 [8];
  anon_class_24_3_22be947d make_error;
  int index_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  make_error.proto = (FileDescriptorProto *)((long)&make_error.index + 4);
  local_38 = (undefined1  [8])this;
  make_error.this = (DescriptorBuilder *)proto;
  make_error.index._4_4_ = index;
  this_00 = FileDescriptorProto::dependency_abi_cxx11_(proto,index);
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
  FunctionRef<google::protobuf::DescriptorBuilder::AddImportError(google::protobuf::FileDescriptorProto_const&,int)::__0,void>
            ((FunctionRef<std::__cxx11::string()> *)&local_58,(anon_class_24_3_22be947d *)local_38);
  make_error_00.invoker_ = local_50;
  make_error_00.ptr_.obj = local_58.obj;
  AddError(this,local_48,&proto->super_Message,IMPORT,make_error_00);
  return;
}

Assistant:

void DescriptorBuilder::AddImportError(const FileDescriptorProto& proto,
                                       int index) {
  auto make_error = [&] {
    if (pool_->fallback_database_ == nullptr) {
      return absl::StrCat("Import \"", proto.dependency(index),
                          "\" has not been loaded.");
    }
    return absl::StrCat("Import \"", proto.dependency(index),
                        "\" was not found or had errors.");
  };
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT, make_error);
}